

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
SharedPtrTests_base_SimpleDestructor_Test::~SharedPtrTests_base_SimpleDestructor_Test
          (SharedPtrTests_base_SimpleDestructor_Test *this)

{
  SharedPtrTests_base_SimpleDestructor_Test *this_local;
  
  ~SharedPtrTests_base_SimpleDestructor_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SharedPtrTests_base, SimpleDestructor) {
	int* a;
	a = new int;
	*a = 1234;
	SharedPtr<int> testingPtr(a);
	testingPtr.~SharedPtr();
	EXPECT_EQ(testingPtr.get(), nullptr);	
	EXPECT_EQ(testingPtr.use_count(), 0);
	EXPECT_TRUE(!testingPtr);
}